

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_compress.hpp
# Opt level: O0

void __thiscall
duckdb::AlpRDCompressionState<double>::CompressVector(AlpRDCompressionState<double> *this)

{
  bool bVar1;
  pointer pCVar2;
  const_data_ptr_t ptr;
  AlpRDCompressionState<double> *in_RDI;
  double floating_point_value;
  idx_t i;
  unsigned_long row_start;
  AlpRDCompressionState<double> *in_stack_00000070;
  idx_t in_stack_000000a8;
  AlpRDCompressionState<double> *in_stack_000000b0;
  State *in_stack_00002810;
  idx_t in_stack_00002818;
  EXACT_TYPE *in_stack_00002820;
  double in_stack_ffffffffffffffc8;
  __int_type __i;
  AlpRDCompressionState<double> *in_stack_ffffffffffffffd0;
  unsigned_long *in_stack_ffffffffffffffe0;
  ulong local_18;
  
  if (in_RDI->nulls_idx != 0) {
    alp::AlpUtils::FindAndReplaceNullsInVector<unsigned_long>
              (in_stack_ffffffffffffffe0,(uint16_t *)in_RDI,(idx_t)in_stack_ffffffffffffffd0,
               (idx_t)in_stack_ffffffffffffffc8);
  }
  alp::AlpRDCompression<double,_false>::Compress
            (in_stack_00002820,in_stack_00002818,in_stack_00002810);
  bVar1 = HasEnoughSpace(in_RDI);
  if (!bVar1) {
    pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                         *)in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 =
         (AlpRDCompressionState<double> *)(pCVar2->super_SegmentBase<duckdb::ColumnSegment>).start;
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                *)in_stack_ffffffffffffffd0);
    ::std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)in_RDI);
    FlushSegment(in_stack_00000070);
    CreateEmptySegment(in_stack_000000b0,in_stack_000000a8);
  }
  if (in_RDI->vector_idx != in_RDI->nulls_idx) {
    for (local_18 = 0; local_18 < in_RDI->vector_idx; local_18 = local_18 + 1) {
      ptr = const_data_ptr_cast<unsigned_long>(in_RDI->input_vector + local_18);
      Load<double>(ptr);
      unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
      operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                  *)in_stack_ffffffffffffffd0);
      BaseStatistics::UpdateNumericStats<double>
                ((BaseStatistics *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  __i = in_RDI->vector_idx;
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_stack_ffffffffffffffd0);
  ::std::__atomic_base<unsigned_long>::operator+=
            (&(pCVar2->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>,__i);
  FlushVector(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void CompressVector() {
		if (nulls_idx) {
			alp::AlpUtils::FindAndReplaceNullsInVector<EXACT_TYPE>(input_vector, vector_null_positions, vector_idx,
			                                                       nulls_idx);
		}
		alp::AlpRDCompression<T, false>::Compress(input_vector, vector_idx, state);
		//! Check if the compressed vector fits on current segment
		if (!HasEnoughSpace()) {
			auto row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
		}
		if (vector_idx != nulls_idx) { //! At least there is one valid value in the vector
			for (idx_t i = 0; i < vector_idx; i++) {
				T floating_point_value = Load<T>(const_data_ptr_cast(&input_vector[i]));
				current_segment->stats.statistics.UpdateNumericStats<T>(floating_point_value);
			}
		}
		current_segment->count += vector_idx;
		FlushVector();
	}